

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBindingShaderAccessTests.cpp
# Opt level: O2

Vec4 __thiscall
vkt::BindingModel::anon_unknown_1::TexelBufferInstanceBuffers::fetchTexelValue
          (TexelBufferInstanceBuffers *this,int fetchPosNdx)

{
  int iVar1;
  uint in_EDX;
  undefined4 in_register_00000034;
  Vec4 VVar2;
  
  iVar1 = 0x58;
  if (*(int *)CONCAT44(in_register_00000034,fetchPosNdx) == 1) {
    iVar1 = 0x30;
  }
  if ((in_EDX & 1) == 0) {
    iVar1 = 0x30;
  }
  VVar2 = tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)this,fetchPosNdx + iVar1,
                     (&BindingModel::(anonymous_namespace)::TexelBufferInstanceBuffers::
                       getFetchPos(int)::fetchPositions)[(int)in_EDX],0);
  return (Vec4)VVar2.m_data;
}

Assistant:

tcu::Vec4 TexelBufferInstanceBuffers::fetchTexelValue (int fetchPosNdx) const
{
	// source order is ABAB
	const tcu::ConstPixelBufferAccess&	texelSrcA	= m_sourceViewA;
	const tcu::ConstPixelBufferAccess&	texelSrcB	= (m_numTexelBuffers == 1) ? (m_sourceViewA) : (m_sourceViewB);
	const tcu::ConstPixelBufferAccess&	texelSrc	= ((fetchPosNdx % 2) == 0) ? (texelSrcA) : (texelSrcB);

	return texelSrc.getPixel(getFetchPos(fetchPosNdx), 0, 0);
}